

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O1

vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> * __thiscall
winmd::reader::cache::nested_types(cache *this,TypeDef *enclosing_type)

{
  const_iterator cVar1;
  _Base_ptr *local_10;
  
  cVar1 = std::
          _Rb_tree<winmd::reader::TypeDef,_std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>,_std::_Select1st<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
          ::find(&(this->m_nested_types)._M_t,enclosing_type);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->m_nested_types)._M_t._M_impl.super__Rb_tree_header
     ) {
    if (nested_types(winmd::reader::TypeDef_const&)::empty == '\0') {
      nested_types();
    }
    else {
      local_10 = (_Base_ptr *)&nested_types::empty;
    }
  }
  else {
    local_10 = &cVar1._M_node[1]._M_left;
  }
  return (vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)local_10;
}

Assistant:

std::vector<TypeDef> const& nested_types(TypeDef const& enclosing_type) const
        {
            auto it = m_nested_types.find(enclosing_type);
            if (it != m_nested_types.end())
            {
                return it->second;
            }
            else
            {
                static const std::vector<TypeDef> empty;
                return empty;
            }
        }